

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCompAndExpr(xmlXPathParserContextPtr ctxt)

{
  byte bVar1;
  int ch1;
  byte *pbVar2;
  
  xmlXPathCompEqualityExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar2 = ctxt->cur;
    while( true ) {
      bVar1 = *pbVar2;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
      pbVar2 = pbVar2 + 1;
      ctxt->cur = pbVar2;
    }
    while ((bVar1 == 0x61 && ((pbVar2[1] == 0x6e && (pbVar2[2] == 100))))) {
      ch1 = ctxt->comp->last;
      pbVar2 = pbVar2 + 3;
      while( true ) {
        ctxt->cur = pbVar2;
        if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
        pbVar2 = pbVar2 + 1;
      }
      xmlXPathCompEqualityExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_AND,0,0,0,(void *)0x0,(void *)0x0);
      pbVar2 = ctxt->cur;
      while( true ) {
        bVar1 = *pbVar2;
        if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
        pbVar2 = pbVar2 + 1;
        ctxt->cur = pbVar2;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompAndExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompEqualityExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == 'a') && (NXT(1) == 'n') && (NXT(2) == 'd')) {
	int op1 = ctxt->comp->last;
        SKIP(3);
	SKIP_BLANKS;
        xmlXPathCompEqualityExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_AND, op1, ctxt->comp->last, 0, 0);
	SKIP_BLANKS;
    }
}